

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int http_should_fail(connectdata *conn)

{
  int iVar1;
  Curl_easy *pCVar2;
  int httpcode;
  Curl_easy *data;
  connectdata *conn_local;
  
  pCVar2 = conn->data;
  iVar1 = (pCVar2->req).httpcode;
  if (((pCVar2->set).http_fail_on_error & 1U) == 0) {
    conn_local._4_4_ = 0;
  }
  else if (iVar1 < 400) {
    conn_local._4_4_ = 0;
  }
  else if ((iVar1 == 0x191) || (iVar1 == 0x197)) {
    if ((iVar1 == 0x191) && (((conn->bits).user_passwd & 1U) == 0)) {
      conn_local._4_4_ = 1;
    }
    else if ((iVar1 == 0x197) && (((conn->bits).proxy_user_passwd & 1U) == 0)) {
      conn_local._4_4_ = 1;
    }
    else {
      conn_local._4_4_ = (uint)((pCVar2->state).authproblem & 1);
    }
  }
  else {
    conn_local._4_4_ = 1;
  }
  return conn_local._4_4_;
}

Assistant:

static int http_should_fail(struct connectdata *conn)
{
  struct Curl_easy *data;
  int httpcode;

  DEBUGASSERT(conn);
  data = conn->data;
  DEBUGASSERT(data);

  httpcode = data->req.httpcode;

  /*
  ** If we haven't been asked to fail on error,
  ** don't fail.
  */
  if(!data->set.http_fail_on_error)
    return 0;

  /*
  ** Any code < 400 is never terminal.
  */
  if(httpcode < 400)
    return 0;

  /*
  ** Any code >= 400 that's not 401 or 407 is always
  ** a terminal error
  */
  if((httpcode != 401) && (httpcode != 407))
    return 1;

  /*
  ** All we have left to deal with is 401 and 407
  */
  DEBUGASSERT((httpcode == 401) || (httpcode == 407));

  /*
  ** Examine the current authentication state to see if this
  ** is an error.  The idea is for this function to get
  ** called after processing all the headers in a response
  ** message.  So, if we've been to asked to authenticate a
  ** particular stage, and we've done it, we're OK.  But, if
  ** we're already completely authenticated, it's not OK to
  ** get another 401 or 407.
  **
  ** It is possible for authentication to go stale such that
  ** the client needs to reauthenticate.  Once that info is
  ** available, use it here.
  */

  /*
  ** Either we're not authenticating, or we're supposed to
  ** be authenticating something else.  This is an error.
  */
  if((httpcode == 401) && !conn->bits.user_passwd)
    return TRUE;
  if((httpcode == 407) && !conn->bits.proxy_user_passwd)
    return TRUE;

  return data->state.authproblem;
}